

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::SwitchStatement(SQCompiler *this)

{
  SQScope *pSVar1;
  SQUnsignedInteger *pSVar2;
  SQUnsignedInteger SVar3;
  long lVar4;
  bool bVar5;
  SQInteger SVar6;
  SQUnsignedInteger SVar7;
  SQInteger SVar8;
  long lVar9;
  ulong pos;
  SQFuncState *pSVar10;
  ulong pos_00;
  SQScope __oldscope__;
  
  Lex(this);
  Expect(this,0x28);
  CommaExpr(this);
  Expect(this,0x29);
  Expect(this,0x7b);
  SVar6 = SQFuncState::TopTarget(this->_fs);
  SVar3 = (this->_fs->_unresolvedbreaks)._size;
  __oldscope__.outers = 0;
  sqvector<long_long>::push_back(&this->_fs->_breaktargets,&__oldscope__.outers);
  pSVar1 = &this->_scope;
  bVar5 = true;
  pos = 0xffffffffffffffff;
  pos_00 = pos;
  while (lVar9 = this->_token, lVar9 == 300) {
    if (!bVar5) {
      SQFuncState::AddInstruction(this->_fs,_OP_JMP,0,0,0,0);
      pos_00 = (this->_fs->_instructions)._size - 1;
      SQFuncState::SetIntructionParam(this->_fs,pos,1,pos_00 - pos);
    }
    Lex(this);
    Expression(this);
    Expect(this,0x3a);
    SVar7 = SQFuncState::PopTarget(this->_fs);
    bVar5 = SQFuncState::IsLocal(this->_fs,SVar7);
    if (bVar5) {
      SVar8 = SQFuncState::PushTarget(this->_fs,-1);
      SQFuncState::AddInstruction(this->_fs,_OP_EQ,SVar8,SVar7,SVar6,0);
      SQFuncState::AddInstruction(this->_fs,_OP_JZ,SVar8,0,0,0);
      SQFuncState::PopTarget(this->_fs);
    }
    else {
      SQFuncState::AddInstruction(this->_fs,_OP_EQ,SVar7,SVar7,SVar6,0);
      SQFuncState::AddInstruction(this->_fs,_OP_JZ,SVar7,0,0,0);
    }
    if (pos_00 != 0xffffffffffffffff) {
      SQFuncState::SetIntructionParam(this->_fs,pos_00,1,~pos_00 + (this->_fs->_instructions)._size)
      ;
    }
    pSVar10 = this->_fs;
    SVar7 = (pSVar10->_instructions)._size;
    __oldscope__.outers = pSVar1->outers;
    __oldscope__.stacksize = (this->_scope).stacksize;
    (this->_scope).outers = pSVar10->_outers;
    SVar8 = SQFuncState::GetStackSize(pSVar10);
    (this->_scope).stacksize = SVar8;
    Statements(this);
    lVar9 = this->_fs->_outers;
    SVar8 = SQFuncState::GetStackSize(this->_fs);
    lVar4 = (this->_scope).stacksize;
    if (SVar8 != lVar4) {
      SQFuncState::SetStackSize(this->_fs,lVar4);
      if (lVar9 != this->_fs->_outers) {
        SQFuncState::AddInstruction(this->_fs,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
      }
    }
    pos = SVar7 - 1;
    pSVar1->outers = __oldscope__.outers;
    (this->_scope).stacksize = __oldscope__.stacksize;
    bVar5 = false;
  }
  if (pos != 0xffffffffffffffff) {
    SQFuncState::SetIntructionParam(this->_fs,pos,1,~pos + (this->_fs->_instructions)._size);
    lVar9 = this->_token;
  }
  if (lVar9 == 0x12d) {
    Lex(this);
    Expect(this,0x3a);
    __oldscope__.outers = pSVar1->outers;
    __oldscope__.stacksize = (this->_scope).stacksize;
    pSVar10 = this->_fs;
    (this->_scope).outers = pSVar10->_outers;
    SVar6 = SQFuncState::GetStackSize(pSVar10);
    (this->_scope).stacksize = SVar6;
    Statements(this);
    lVar9 = this->_fs->_outers;
    SVar6 = SQFuncState::GetStackSize(this->_fs);
    lVar4 = (this->_scope).stacksize;
    if (SVar6 != lVar4) {
      SQFuncState::SetStackSize(this->_fs,lVar4);
      if (lVar9 != this->_fs->_outers) {
        SQFuncState::AddInstruction(this->_fs,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
      }
    }
    pSVar1->outers = __oldscope__.outers;
    (this->_scope).stacksize = __oldscope__.stacksize;
  }
  Expect(this,0x7d);
  SQFuncState::PopTarget(this->_fs);
  pSVar10 = this->_fs;
  lVar9 = (pSVar10->_unresolvedbreaks)._size - SVar3;
  if (0 < lVar9) {
    ResolveBreaks(this,pSVar10,lVar9);
    pSVar10 = this->_fs;
  }
  pSVar2 = &(pSVar10->_breaktargets)._size;
  *pSVar2 = *pSVar2 - 1;
  return;
}

Assistant:

void SwitchStatement()
    {
        Lex(); Expect(_SC('(')); CommaExpr(); Expect(_SC(')'));
        Expect(_SC('{'));
        SQInteger expr = _fs->TopTarget();
        bool bfirst = true;
        SQInteger tonextcondjmp = -1;
        SQInteger skipcondjmp = -1;
        SQInteger __nbreaks__ = _fs->_unresolvedbreaks.size();
        _fs->_breaktargets.push_back(0);
        while(_token == TK_CASE) {
            if(!bfirst) {
                _fs->AddInstruction(_OP_JMP, 0, 0);
                skipcondjmp = _fs->GetCurrentPos();
                _fs->SetIntructionParam(tonextcondjmp, 1, _fs->GetCurrentPos() - tonextcondjmp);
            }
            //condition
            Lex(); Expression(); Expect(_SC(':'));
            SQInteger trg = _fs->PopTarget();
            SQInteger eqtarget = trg;
            bool local = _fs->IsLocal(trg);
            if(local) {
                eqtarget = _fs->PushTarget(); //we need to allocate a extra reg
            }
            _fs->AddInstruction(_OP_EQ, eqtarget, trg, expr);
            _fs->AddInstruction(_OP_JZ, eqtarget, 0);
            if(local) {
                _fs->PopTarget();
            }

            //end condition
            if(skipcondjmp != -1) {
                _fs->SetIntructionParam(skipcondjmp, 1, (_fs->GetCurrentPos() - skipcondjmp));
            }
            tonextcondjmp = _fs->GetCurrentPos();
            BEGIN_SCOPE();
            Statements();
            END_SCOPE();
            bfirst = false;
        }
        if(tonextcondjmp != -1)
            _fs->SetIntructionParam(tonextcondjmp, 1, _fs->GetCurrentPos() - tonextcondjmp);
        if(_token == TK_DEFAULT) {
            Lex(); Expect(_SC(':'));
            BEGIN_SCOPE();
            Statements();
            END_SCOPE();
        }
        Expect(_SC('}'));
        _fs->PopTarget();
        __nbreaks__ = _fs->_unresolvedbreaks.size() - __nbreaks__;
        if(__nbreaks__ > 0)ResolveBreaks(_fs, __nbreaks__);
        _fs->_breaktargets.pop_back();
    }